

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::ParseFloat(LiteralType literal_type,char *s,char *end,uint32_t *out_bits)

{
  Result RVar1;
  uint32_t *out_bits_local;
  char *end_local;
  char *s_local;
  LiteralType literal_type_local;
  
  RVar1 = anon_unknown_0::FloatParser<float>::Parse(literal_type,s,end,out_bits);
  return (Result)RVar1.enum_;
}

Assistant:

Result ParseFloat(LiteralType literal_type,
                  const char* s,
                  const char* end,
                  uint32_t* out_bits) {
  return FloatParser<float>::Parse(literal_type, s, end, out_bits);
}